

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  undefined1 uVar4;
  int iVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  runtime_error *this;
  long *plVar8;
  bool bVar9;
  seed_t sVar10;
  undefined1 uVar11;
  pointer __rhs;
  char cVar12;
  text val;
  text opt;
  texts in;
  int local_22c;
  undefined1 local_228;
  undefined1 local_220;
  undefined1 local_218;
  undefined1 local_210;
  undefined1 local_208;
  undefined1 local_200;
  undefined1 local_1f8 [24];
  undefined8 uStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  ulong local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  seed_t local_170;
  undefined1 local_168 [24];
  undefined1 local_150;
  undefined1 uStack_14f;
  undefined1 uStack_14e;
  undefined1 uStack_14d;
  undefined1 uStack_14c;
  undefined1 uStack_14b;
  undefined1 uStack_14a;
  undefined1 uStack_149;
  char cStack_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  int iStack_144;
  seed_t local_140;
  text local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  pointer pbStack_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c8;
  text local_c0;
  text local_a0;
  runtime_error local_80 [16];
  text local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__rhs == paVar7) {
    local_22c = 1;
    local_228 = 0;
    uVar11 = 0;
    uVar4 = 0;
    local_1a0 = 0;
    local_1a8 = 0;
    cVar12 = '\0';
    local_198 = 0;
    sVar10 = 0;
    local_218 = 0;
    local_220 = 0;
    local_210 = 0;
    local_208 = 0;
    local_200 = 0;
  }
  else {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1f8 + 0x10);
    local_22c = 1;
    bVar9 = true;
    local_200 = 0;
    local_208 = 0;
    local_210 = 0;
    local_220 = 0;
    local_218 = 0;
    local_170 = 0;
    local_198 = 0;
    local_1b8 = 0;
    local_1a8 = 0;
    local_1a0 = 0;
    uVar4 = 0;
    local_1b0 = 0;
    local_228 = 0;
    local_f8 = paVar7;
    local_c8 = __return_storage_ptr__;
    do {
      if (bVar9) {
        local_168._0_8_ = local_168 + 0x10;
        local_168._8_8_ = (pointer)0x0;
        local_168._16_8_ = local_168._16_8_ & 0xffffffffffffff00;
        local_190 = local_180;
        local_188 = 0;
        local_180[0] = 0;
        pcVar2 = (__rhs->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + __rhs->_M_string_length);
        split_option((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1f8,&local_70);
        std::__cxx11::string::operator=((string *)local_168,(string *)local_1d8._M_local_buf);
        std::__cxx11::string::operator=((string *)&local_190,(string *)local_1f8);
        puVar3 = (undefined1 *)
                 CONCAT44(local_1d8._M_allocated_capacity._4_4_,
                          CONCAT13(local_1d8._M_local_buf[3],
                                   CONCAT12(local_1d8._M_local_buf[2],
                                            CONCAT11(local_1d8._M_local_buf[1],
                                                     local_1d8._M_local_buf[0]))));
        if (puVar3 != local_1c8) {
          operator_delete(puVar3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._0_8_ != paVar1) {
          operator_delete((void *)local_1f8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        cVar12 = *(char *)&((_Alloc_hider *)local_168._0_8_)->_M_p;
        if (cVar12 == '-') {
          iVar5 = std::__cxx11::string::compare(local_168);
          if (iVar5 == 0) goto LAB_00117a56;
          iVar5 = std::__cxx11::string::compare(local_168);
          if (iVar5 == 0) {
LAB_00117a5a:
            local_200 = 1;
LAB_00117a8e:
            bVar9 = true;
          }
          else {
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) goto LAB_00117a5a;
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) {
LAB_00117a63:
              local_208 = 1;
              goto LAB_00117a8e;
            }
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) goto LAB_00117a63;
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) {
LAB_00117a6c:
              local_210 = 1;
              goto LAB_00117a8e;
            }
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) goto LAB_00117a6c;
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) {
LAB_00117a75:
              local_218 = 1;
              goto LAB_00117a8e;
            }
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) goto LAB_00117a75;
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) {
LAB_00117a7e:
              local_220 = 1;
              goto LAB_00117a8e;
            }
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) goto LAB_00117a7e;
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) {
LAB_00117a87:
              local_228 = 1;
              goto LAB_00117a8e;
            }
            iVar5 = std::__cxx11::string::compare(local_168);
            if (iVar5 == 0) goto LAB_00117a87;
            uVar6 = std::__cxx11::string::compare(local_168);
            bVar9 = true;
            if ((int)uVar6 != 0) {
              uVar6 = std::__cxx11::string::compare(local_168);
              if ((int)uVar6 == 0) goto LAB_00117afb;
              iVar5 = std::__cxx11::string::compare(local_168);
              if (iVar5 != 0) {
                iVar5 = std::__cxx11::string::compare(local_168);
                if (iVar5 == 0) goto LAB_00117b07;
                uVar6 = std::__cxx11::string::compare(local_168);
                if ((int)uVar6 == 0) {
LAB_00117b12:
                  local_1b8 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
                  goto LAB_00117a8e;
                }
                uVar6 = std::__cxx11::string::compare(local_168);
                if ((int)uVar6 == 0) goto LAB_00117b12;
                uVar6 = std::__cxx11::string::compare(local_168);
                bVar9 = true;
                if ((int)uVar6 != 0) {
                  iVar5 = std::__cxx11::string::compare(local_168);
                  if (iVar5 == 0) {
                    iVar5 = std::__cxx11::string::compare((char *)&local_190);
                    if (iVar5 == 0) goto LAB_00117a91;
                  }
                  iVar5 = std::__cxx11::string::compare(local_168);
                  if (iVar5 != 0) {
LAB_00117989:
                    iVar5 = std::__cxx11::string::compare(local_168);
                    if (iVar5 == 0) {
                      uVar6 = std::__cxx11::string::compare((char *)&local_190);
                      if ((int)uVar6 == 0) {
                        local_1a8 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
                        goto LAB_00117a8e;
                      }
                    }
                    iVar5 = std::__cxx11::string::compare(local_168);
                    if (iVar5 == 0) {
                      local_1f8._0_8_ = paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--random-seed","");
                      local_118._M_allocated_capacity = (size_type)&local_108;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1f8._0_8_ ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_1f8 + 0x10)) {
                        local_108._8_4_ = (undefined4)uStack_1e0;
                        local_108._12_4_ = uStack_1e0._4_4_;
                      }
                      else {
                        local_118._M_allocated_capacity = local_1f8._0_8_;
                      }
                      local_108._M_allocated_capacity = local_1f8._16_8_;
                      local_118._8_8_ = local_1f8._8_8_;
                      local_1f8._8_8_ = (pointer)0x0;
                      local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
                      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                      local_1f8._0_8_ = paVar1;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_a0,local_190,local_190 + local_188);
                      local_170 = seed((text *)&local_118,&local_a0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                        operator_delete(local_a0._M_dataplus._M_p);
                      }
                      paVar7 = &local_108;
                      uVar6 = local_118._M_allocated_capacity;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare(local_168);
                      if (iVar5 != 0) {
                        this = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::operator+(&local_50,"unrecognised option \'",__rhs);
                        plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
                        local_1f8._0_8_ = *plVar8;
                        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(plVar8 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1f8._0_8_ == paVar7) {
                          local_1f8._16_8_ = paVar7->_M_allocated_capacity;
                          uStack_1e0 = plVar8[3];
                          local_1f8._0_8_ = paVar1;
                        }
                        else {
                          local_1f8._16_8_ = paVar7->_M_allocated_capacity;
                        }
                        local_1f8._8_8_ = plVar8[1];
                        *plVar8 = (long)paVar7;
                        plVar8[1] = 0;
                        *(undefined1 *)(plVar8 + 2) = 0;
                        std::runtime_error::runtime_error(local_80,(string *)local_1f8);
                        std::runtime_error::runtime_error(this,local_80);
                        __cxa_throw(this,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_1f8._0_8_ = paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--repeat","");
                      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1f8._0_8_ ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_1f8 + 0x10)) {
                        local_138.field_2._8_4_ = (undefined4)uStack_1e0;
                        local_138.field_2._12_4_ = uStack_1e0._4_4_;
                      }
                      else {
                        local_138._M_dataplus._M_p = (pointer)local_1f8._0_8_;
                      }
                      local_138.field_2._M_allocated_capacity = local_1f8._16_8_;
                      local_138._M_string_length = local_1f8._8_8_;
                      local_1f8._8_8_ = (pointer)0x0;
                      local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
                      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                      local_1f8._0_8_ = paVar1;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_c0,local_190,local_190 + local_188);
                      local_22c = repeat(&local_138,&local_c0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                        operator_delete(local_c0._M_dataplus._M_p);
                      }
                      paVar7 = &local_138.field_2;
                      uVar6 = local_138._M_dataplus._M_p;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)uVar6 != paVar7) {
                      operator_delete((void *)uVar6);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f8._0_8_ != paVar1) {
                      operator_delete((void *)local_1f8._0_8_);
                    }
                    goto LAB_00117a91;
                  }
                  uVar6 = std::__cxx11::string::compare((char *)&local_190);
                  if ((int)uVar6 != 0) goto LAB_00117989;
                  local_1a0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
                  goto LAB_00117a8e;
                }
                local_198 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
                goto LAB_00117a91;
              }
LAB_00117b07:
              uVar4 = 1;
              goto LAB_00117a8e;
            }
LAB_00117afb:
            local_1b0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
          }
        }
        else {
LAB_00117a56:
          bVar9 = false;
        }
LAB_00117a91:
        if (local_190 != local_180) {
          operator_delete(local_190);
        }
        if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_);
        }
        paVar7 = local_f8;
        if (cVar12 != '-') goto LAB_00117ad9;
      }
      else {
        bVar9 = false;
LAB_00117ad9:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_e8,__rhs);
      }
      __rhs = __rhs + 1;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__rhs != paVar7);
    uVar11 = 1;
    if ((local_1b0 & 1) == 0) {
      uVar11 = uVar4;
    }
    cVar12 = (char)local_1b8;
    __return_storage_ptr__ = local_c8;
    sVar10 = local_170;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1f8,&local_e8);
  uVar6 = local_1f8._16_8_;
  local_150 = local_200;
  uStack_14f = local_208;
  uStack_14e = local_210;
  uStack_14d = local_220;
  uStack_14c = local_218;
  uStack_14b = local_228;
  uStack_1e0 = CONCAT17(uVar4,CONCAT16(uVar11,CONCAT15(local_228,
                                                       CONCAT14(local_218,
                                                                CONCAT13(local_220,
                                                                         CONCAT12(local_210,
                                                                                  CONCAT11(local_208
                                                  ,local_200)))))));
  local_1d8._M_local_buf[0] = (char)local_1a0;
  local_1d8._M_local_buf[1] = (char)local_1a8;
  local_1d8._M_local_buf[3] = (char)local_198;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1f8._0_8_;
  pbStack_f0 = (pointer)local_1f8._8_8_;
  local_1f8._0_8_ = (pointer)0x0;
  local_1f8._8_8_ = (pointer)0x0;
  local_1f8._16_8_ = (pointer)0x0;
  local_1d8._M_local_buf[2] = cVar12;
  local_1d8._M_allocated_capacity._4_4_ = local_22c;
  local_1d8._8_8_ = sVar10;
  uStack_14a = uVar11;
  uStack_149 = uVar4;
  cStack_148 = local_1d8._M_local_buf[0];
  cStack_147 = local_1d8._M_local_buf[1];
  cStack_146 = cVar12;
  cStack_145 = local_1d8._M_local_buf[3];
  iStack_144 = local_22c;
  local_140 = sVar10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1f8);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(__return_storage_ptr__->
        super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ).
        super__Tuple_impl<1UL,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<1UL,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data = local_f8;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ).
           super__Tuple_impl<1UL,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<1UL,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) = pbStack_f0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ).
           super__Tuple_impl<1UL,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<1UL,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = uVar6;
  local_168._16_8_ = (pointer)0x0;
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.seed = local_140;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.help = (bool)local_150;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.abort = (bool)uStack_14f;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.count = (bool)uStack_14e;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.list = (bool)uStack_14d;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.tags = (bool)uStack_14c;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.time = (bool)uStack_14b;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.pass = (bool)uStack_14a;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.zen = (bool)uStack_149;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.lexical = (bool)cStack_148;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.random = (bool)cStack_147;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.verbose = (bool)cStack_146;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.version = (bool)cStack_145;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.repeat = iStack_144;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

inline auto split_arguments( texts args ) -> std::tuple<options, texts>
{
    options option; texts in;

    bool in_options = true;

    for ( auto & arg : args )
    {
        if ( in_options )
        {
            text opt, val;
            std::tie( opt, val ) = split_option( arg );

            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + arg + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_tuple( option, in );
}